

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature_parser.c
# Opt level: O3

uint8_t * apx_signatureParser_parse_type_reference
                    (apx_signatureParser_t *self,uint8_t *begin,uint8_t *end)

{
  apx_error_t aVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  uint32_t type_id;
  undefined8 uStack_28;
  
  if (end <= begin) {
    return begin;
  }
  if (*begin != '[') {
    return begin;
  }
  uStack_28 = begin;
  puVar2 = bstr_lstrip(begin + 1,end);
  if (end <= puVar2) {
    return (uint8_t *)0x0;
  }
  if (*puVar2 == '\"') {
    puVar3 = bstr_match_pair(puVar2,end,'\"','\"','\\');
    if (puVar3 <= puVar2) {
      return (uint8_t *)0x0;
    }
    aVar1 = apx_dataElement_set_type_ref_name_bstr(self->state->data_element,puVar2 + 1,puVar3);
    if (aVar1 != 0) {
      self->error_code = aVar1;
      self->error_pos = puVar2;
      return (uint8_t *)0x0;
    }
    puVar3 = puVar3 + 1;
  }
  else {
    puVar3 = apx_parserBase_parse_u32(puVar2,end,(uint32_t *)((long)&uStack_28 + 4));
    if (puVar3 <= puVar2) {
      return (uint8_t *)0x0;
    }
    apx_dataElement_set_type_ref_id(self->state->data_element,uStack_28._4_4_);
  }
  puVar2 = bstr_lstrip(puVar3,end);
  if (end <= puVar2) {
    return (uint8_t *)0x0;
  }
  if (*puVar2 == ']') {
    return puVar2 + 1;
  }
  return (uint8_t *)0x0;
}

Assistant:

static uint8_t const* apx_signatureParser_parse_type_reference(apx_signatureParser_t* self, uint8_t const* begin, uint8_t const* end)
{
   const uint8_t* next = begin;
   if (next < end)
   {
      uint8_t c;
      if (*next++ != '[')
      {
         return begin;
      }
      next = bstr_lstrip(next, end);
      if (next >= end)
      {
         return NULL;
      }
      c = *next;
      if (c == '"')
      {
         uint8_t const* result = bstr_match_pair(next, end, '"', '"', '\\');
         if (result > next)
         {
            apx_error_t rc = apx_dataElement_set_type_ref_name_bstr(self->state->data_element, next + 1, result);
            if (rc != APX_NO_ERROR)
            {
               apx_signatureParser_set_error(self, rc, next);
               return NULL;
            }
            next = result + 1;
         }
         else
         {
            return NULL;
         }
      }
      else
      {
         uint32_t type_id;
         uint8_t const* result = apx_parserBase_parse_u32(next, end, &type_id);
         if (result > next)
         {
            apx_dataElement_set_type_ref_id(self->state->data_element, type_id);
            next = result;
         }
         else
         {
            return NULL;
         }
      }
      next = bstr_lstrip(next, end);
      if (next >= end)
      {
         return NULL;
      }
      if (*next++ != ']')
      {
         return NULL;
      }
   }
   return next;
}